

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int recomputeColumnsUsedExpr(Walker *pWalker,Expr *pExpr)

{
  SrcItem *pSVar1;
  Bitmask BVar2;
  SrcItem *pItem;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if (((pExpr->op == 0xa7) && (pSVar1 = (pWalker->u).pSrcItem, pSVar1->iCursor == pExpr->iTable)) &&
     (-1 < pExpr->iColumn)) {
    BVar2 = sqlite3ExprColUsed(pExpr);
    pSVar1->colUsed = BVar2 | pSVar1->colUsed;
  }
  return 0;
}

Assistant:

static int recomputeColumnsUsedExpr(Walker *pWalker, Expr *pExpr){
  SrcItem *pItem;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  pItem = pWalker->u.pSrcItem;
  if( pItem->iCursor!=pExpr->iTable ) return WRC_Continue;
  if( pExpr->iColumn<0 ) return WRC_Continue;
  pItem->colUsed |= sqlite3ExprColUsed(pExpr);
  return WRC_Continue;
}